

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

void __thiscall QLocalServerPrivate::closeServer(QLocalServerPrivate *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QLocalServer::SocketOption> in_stack_ffffffffffffffd8;
  SocketOption in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[5].d.ptr != (char16_t *)0x0) {
    QSocketNotifier::setEnabled(SUB81(in_RDI[5].d.ptr,0));
    QObject::deleteLater();
    in_RDI[5].d.ptr = (char16_t *)0x0;
  }
  if (((QFlagsStorage<QLocalServer::SocketOption> *)&in_RDI[5].d.d)->i != 0xffffffff) {
    qt_safe_close((int)((ulong)in_RDI >> 0x20));
  }
  ((QFlagsStorage<QLocalServer::SocketOption> *)&in_RDI[5].d.d)->i = 0xffffffff;
  bVar2 = QString::isEmpty((QString *)0x385987);
  in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
  if (!bVar2) {
    QObjectBindableProperty::operator_cast_to_QFlags_
              ((QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
                *)0x3859a5);
    anon_unknown.dwarf_97e7b5::optionsForPlatform((SocketOptions)in_stack_ffffffffffffffd8.i);
    bVar2 = QFlags<QLocalServer::SocketOption>::testFlag
                      ((QFlags<QLocalServer::SocketOption> *)in_RDI,in_stack_ffffffffffffffdc);
    in_stack_ffffffffffffffdc = (uint)bVar2 << 0x18 ^ 0xff000000;
  }
  if ((in_stack_ffffffffffffffdc & 0x1000000) != NoOptions) {
    QFile::remove((QString *)&in_RDI[6].d.size);
  }
  QString::clear(in_RDI);
  QString::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalServerPrivate::closeServer()
{
    if (socketNotifier) {
        socketNotifier->setEnabled(false); // Otherwise, closed socket is checked before deleter runs
        socketNotifier->deleteLater();
        socketNotifier = nullptr;
    }

    if (-1 != listenSocket)
        QT_CLOSE(listenSocket);
    listenSocket = -1;

    if (!fullServerName.isEmpty()
        && !optionsForPlatform(socketOptions).testFlag(QLocalServer::AbstractNamespaceOption)) {
        QFile::remove(fullServerName);
    }

    serverName.clear();
    fullServerName.clear();
}